

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDateTime toEarliest(QDate day,QTimeZone *zone)

{
  int iVar1;
  Data DVar2;
  Data DVar3;
  Data DVar4;
  Data DVar5;
  QDate QVar6;
  Data DVar7;
  Data DVar8;
  Data DVar9;
  QTime time;
  QTimeZone *in_RDX;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  QDateTime probe_1;
  QDateTime probe;
  QDateTime when;
  QTime local_7c;
  Data local_78;
  QTime local_6c;
  QTime local_68;
  QTime local_64;
  Data local_60;
  QTime local_54;
  Data local_50;
  QDate local_48;
  Data DStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  DStack_40.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.jd = (qint64)zone;
  QTimeZone::QTimeZone((QTimeZone *)&DStack_40.s,in_RDX);
  local_50.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTime::QTime(&local_54,2,0,0,0);
  QDateTime::QDateTime
            ((QDateTime *)&local_50.data,local_48,local_54,(QTimeZone *)&DStack_40.s,Reject);
  DVar2 = local_50;
  if (((ulong)local_50.d & 1) == 0) {
    DVar2._4_4_ = 0;
    DVar2._0_4_ = ((local_50.d)->m_status).
                  super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if (((ulong)DVar2.d & 8) == 0) {
    QTime::QTime(&local_64,0xc,0,0,0);
    QDateTime::QDateTime
              ((QDateTime *)&local_60.data,local_48,local_64,(QTimeZone *)&DStack_40.s,Reject);
    DVar2 = local_50;
    local_50 = local_60;
    local_60.d = DVar2.d;
    QDateTime::~QDateTime((QDateTime *)&local_60.data);
    DVar3 = local_50;
    if (((ulong)local_50.d & 1) == 0) {
      DVar3._4_4_ = 0;
      DVar3._0_4_ = ((local_50.d)->m_status).
                    super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((ulong)DVar3.d & 8) != 0) goto LAB_0034bc95;
    QTime::QTime(&local_68,0x17,0x3b,0x3b,999);
    QDateTime::QDateTime
              ((QDateTime *)&local_60.data,local_48,local_68,(QTimeZone *)&DStack_40.s,Reject);
    DVar2 = local_50;
    local_50 = local_60;
    local_60.d = DVar2.d;
    QDateTime::~QDateTime((QDateTime *)&local_60.data);
    DVar4 = local_50;
    if (((ulong)local_50.d & 1) == 0) {
      DVar4._4_4_ = 0;
      DVar4._0_4_ = ((local_50.d)->m_status).
                    super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((ulong)DVar4.d & 8) != 0) goto LAB_0034bc95;
  }
  else {
LAB_0034bc95:
    if (((ulong)local_50.d & 1) == 0) {
      uVar14 = ((local_50.d)->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
               super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    else {
      uVar14 = local_50._0_4_;
    }
    uVar13 = 0;
    uVar10 = 0;
    if ((uVar14 & 4) != 0) {
      if (((ulong)local_50.d & 1) == 0) {
        uVar10 = (local_50.d)->m_msecs;
      }
      else {
        uVar10 = (long)local_50.d >> 8;
      }
      if ((long)uVar10 < 0) {
        uVar10 = (long)(uVar10 + 1) % 86400000 + 86399999;
      }
      else {
        uVar10 = uVar10 % 86400000;
      }
      uVar10 = (uVar10 & 0xffffffff) / 60000;
    }
    uVar14 = (uint)uVar10;
    if (1 < uVar14) {
      uVar13 = 0;
      do {
        iVar1 = (int)uVar10 + uVar13;
        uVar14 = iVar1 / 2;
        local_60.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QTime::QTime(&local_6c,iVar1 / 0x78,
                     uVar14 + (((int)uVar14 / 0x3c + (iVar1 - (iVar1 >> 0x1f) >> 0x1f)) -
                              ((int)uVar14 >> 0x1f)) * -0x3c,0,0);
        QDateTime::QDateTime((QDateTime *)&local_60.data,(QDate)zone,local_6c,in_RDX,PreferBefore);
        DVar5 = local_60;
        if (((ulong)local_60.d & 1) == 0) {
          DVar5._4_4_ = 0;
          DVar5._0_4_ = ((local_60.d)->m_status).
                        super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
        }
        if ((((ulong)DVar5.d & 8) != 0) &&
           (QVar6 = QDateTime::date((QDateTime *)&local_60.data), (QTimeZone *)QVar6.jd == zone)) {
          QDateTime::operator=((QDateTime *)&local_50.data,(QDateTime *)&local_60.data);
          uVar10 = (ulong)uVar14;
          uVar14 = uVar13;
        }
        uVar13 = uVar14;
        QDateTime::~QDateTime((QDateTime *)&local_60.data);
        uVar14 = (uint)uVar10;
      } while ((int)(uVar13 + 1) < (int)uVar14);
      uVar13 = uVar13 * 0x3c;
    }
    local_60.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    if (((ulong)local_50.d & 1) == 0) {
      uVar11 = ((local_50.d)->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
               super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    else {
      uVar11 = local_50._0_4_;
    }
    time.mds = -1;
    uVar12 = 0xffffffff;
    if ((uVar11 & 4) != 0) {
      if (((ulong)local_50.d & 1) == 0) {
        uVar10 = (local_50.d)->m_msecs;
      }
      else {
        uVar10 = (long)local_50.d >> 8;
      }
      if ((long)uVar10 < 0) {
        uVar12 = (int)(uVar10 + 1) + (int)((long)(uVar10 + 1) / 86400000) * -86400000 + 86399999;
      }
      else {
        uVar12 = (int)uVar10 + (int)(uVar10 / 86400000) * -86400000;
      }
    }
    if (uVar12 < 86400000) {
      if ((int)uVar12 < 1000) {
        time.mds = (int)(uVar12 - 999) % 86400000 + 86399999;
      }
      else {
        time.mds = (uVar12 - 1000) % 86400000;
      }
    }
    QDateTime::QDateTime((QDateTime *)&local_60.data,local_48,time,(QTimeZone *)&DStack_40.s,Reject)
    ;
    DVar7 = local_60;
    if (((ulong)local_60.d & 1) == 0) {
      DVar7._4_4_ = 0;
      DVar7._0_4_ = ((local_60.d)->m_status).
                    super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((((ulong)DVar7.d & 8) != 0) &&
        (QVar6 = QDateTime::date((QDateTime *)&local_60.data), (QTimeZone *)QVar6.jd == zone)) &&
       (uVar14 = uVar14 * 0x3c, (int)(uVar13 | 1) < (int)uVar14)) {
      do {
        iVar1 = uVar14 + uVar13;
        uVar11 = iVar1 / 2;
        local_78.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QTime::QTime(&local_7c,iVar1 / 0x1c20,(iVar1 / 0x78) % 0x3c,(int)uVar11 % 0x3c,0);
        QDateTime::QDateTime
                  ((QDateTime *)&local_78.data,local_48,local_7c,(QTimeZone *)&DStack_40.s,Reject);
        DVar9 = local_78;
        if (((ulong)local_78.d & 1) == 0) {
          DVar9._4_4_ = 0;
          DVar9._0_4_ = ((local_78.d)->m_status).
                        super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
        }
        uVar12 = uVar11;
        if ((((ulong)DVar9.d & 8) != 0) &&
           (QVar6 = QDateTime::date((QDateTime *)&local_78.data), (QTimeZone *)QVar6.jd == zone)) {
          QDateTime::operator=((QDateTime *)&local_50.data,(QDateTime *)&local_78.data);
          uVar12 = uVar13;
          uVar14 = uVar11;
        }
        uVar13 = uVar12;
        QDateTime::~QDateTime((QDateTime *)&local_78.data);
      } while ((int)(uVar13 + 1) < (int)uVar14);
    }
    QDateTime::~QDateTime((QDateTime *)&local_60.data);
    DVar8 = local_50;
    if (((ulong)local_50.d & 1) == 0) {
      DVar8._4_4_ = 0;
      DVar8._0_4_ = ((local_50.d)->m_status).
                    super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((ulong)DVar8.d & 8) != 0) {
      QDateTime::QDateTime((QDateTime *)day.jd,(QDateTime *)&local_50.data);
      goto LAB_0034bf75;
    }
  }
  QDateTime::QDateTime((QDateTime *)day.jd);
LAB_0034bf75:
  QDateTime::~QDateTime((QDateTime *)&local_50.data);
  QTimeZone::~QTimeZone((QTimeZone *)&DStack_40.s);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDateTime)(Data)day.jd;
}

Assistant:

static QDateTime toEarliest(QDate day, const QTimeZone &zone)
{
    Q_ASSERT(!zone.isUtcOrFixedOffset());
    // And the day starts in a gap. First find a moment not in that gap.
    const auto moment = [=](QTime time) {
        return QDateTime(day, time, zone, QDateTime::TransitionResolution::Reject);
    };
    // Longest routine time-zone transition is 2 hours:
    QDateTime when = moment(QTime(2, 0));
    if (!when.isValid()) {
        // Noon should be safe ...
        when = moment(QTime(12, 0));
        if (!when.isValid()) {
            // ... unless it's a 24-hour jump (moving the date-line)
            when = moment(QTime(23, 59, 59, 999));
            if (!when.isValid())
                return QDateTime();
        }
    }
    int high = when.time().msecsSinceStartOfDay() / 60000;
    int low = 0;
    // Binary chop to the right minute
    while (high > low + 1) {
        const int mid = (high + low) / 2;
        const QDateTime probe = QDateTime(day, QTime(mid / 60, mid % 60), zone,
                                          QDateTime::TransitionResolution::PreferBefore);
        if (probe.isValid() && probe.date() == day) {
            high = mid;
            when = probe;
        } else {
            low = mid;
        }
    }
    // Transitions out of local solar mean time, and the few international
    // date-line crossings before that (Alaska, Philippines), may have happened
    // between minute boundaries. Don't try to fix milliseconds.
    if (QDateTime p = moment(when.time().addSecs(-1)); Q_UNLIKELY(p.isValid() && p.date() == day)) {
        high *= 60;
        low *= 60;
        while (high > low + 1) {
            const int mid = (high + low) / 2;
            const int min = mid / 60;
            const QDateTime probe = moment(QTime(min / 60, min % 60, mid % 60));
            if (probe.isValid() && probe.date() == day) {
                high = mid;
                when = probe;
            } else {
                low = mid;
            }
        }
    }
    return when.isValid() ? when : QDateTime();
}